

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall
cmCTestCoverageHandler::EndCoverageLogXML(cmCTestCoverageHandler *this,cmXMLWriter *xml)

{
  cmXMLWriter *this_00;
  double dVar1;
  uint local_98;
  allocator local_91;
  string local_90;
  string local_70;
  allocator local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  cmCTestCoverageHandler *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"EndDateTime",&local_39);
  cmCTest::CurrentTime_abi_cxx11_(&local_70,(this->super_cmCTestGenericHandler).CTest);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"EndTime",&local_91);
  dVar1 = cmsys::SystemTools::GetTime();
  local_98 = (uint)(long)dVar1;
  cmXMLWriter::Element<unsigned_int>(this_00,&local_90,&local_98);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  cmXMLWriter::EndElement(local_18);
  cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,local_18);
  return;
}

Assistant:

void cmCTestCoverageHandler::EndCoverageLogXML(cmXMLWriter& xml)
{
  xml.Element("EndDateTime", this->CTest->CurrentTime());
  xml.Element("EndTime", static_cast<unsigned int>(cmSystemTools::GetTime()));
  xml.EndElement(); // CoverageLog
  this->CTest->EndXML(xml);
}